

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  char **ppcVar1;
  string *this_00;
  string *this_01;
  cmCTest *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pcVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  size_t sVar8;
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  *pvVar9;
  ostream *poVar10;
  long *plVar11;
  rep rVar12;
  undefined7 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int iVar14;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long lVar16;
  char *pcVar17;
  char *pcVar18;
  char **ppcVar19;
  cmCTestBuildErrorWarning *evit;
  pointer pcVar20;
  cmDuration cVar21;
  string_view value;
  int retVal;
  string makeCommand;
  cmGeneratedFileStream xofs;
  cmStringReplaceHelper colorRemover;
  cmXMLWriter xml;
  ostringstream cmCTestLog_msg_14;
  cmGeneratedFileStream ofs;
  int local_a3c;
  long *local_a38;
  long local_a28 [2];
  vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
  *local_a18;
  uint local_a0c;
  string local_a08;
  undefined1 local_9e8 [112];
  ios_base local_978 [504];
  string local_780;
  string local_760;
  string local_740;
  undefined1 local_720 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710;
  _Alloc_hider local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0 [4];
  ios_base local_6b0 [424];
  char *local_508;
  char *local_4f8;
  int local_4f0;
  char *local_4c0;
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  local_488;
  undefined1 local_468 [88];
  undefined1 local_410 [112];
  ios_base local_3a0 [264];
  undefined1 local_298 [16];
  _func_int *local_288 [12];
  ios_base local_228 [504];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_720,"Build project",0xd);
  std::ios::widen((char)(ostringstream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_720);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x12d,(char *)local_298._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
  std::ios_base::~ios_base(local_6b0);
  cVar21 = cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  iVar14 = 0;
  if (120.0 <= cVar21.__r) {
    local_a18 = &this->ErrorWarningFileLineRegex;
    pcVar18 = "^Warning W[0-9]+ ([a-zA-Z.\\:/0-9_+ ~-]+) ([0-9]+):";
    lVar16 = 0;
    do {
      local_508 = (char *)0x0;
      local_4f8 = (char *)0x0;
      local_4f0 = 0;
      memset((RegularExpression *)(local_720 + 8),0,0x20a);
      bVar7 = cmsys::RegularExpression::compile((RegularExpression *)(local_720 + 8),pcVar18);
      if (bVar7) {
        local_720._0_8_ = *(undefined8 *)((long)&cmCTestWarningErrorFileLine[0].FileIndex + lVar16);
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::emplace_back<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>
                  (local_a18,(cmCTestCompileErrorWarningRex *)local_720);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Problem Compiling regular expression: ",0x26);
        sVar8 = strlen(pcVar18);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,pcVar18,sVar8);
        cVar5 = (char)(ostringstream *)local_298;
        std::ios::widen((char)*(_func_int **)(local_298._0_8_ + -0x18) + cVar5);
        std::ostream::put(cVar5);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x142,(char *)local_9e8._0_8_,false);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
      }
      if (local_4f8 != (char *)0x0) {
        operator_delete__(local_4f8);
      }
      pcVar18 = *(char **)((long)&cmCTestWarningErrorFileLine[1].RegularExpressionString + lVar16);
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x80);
    GetMakeCommand_abi_cxx11_(&local_a08,this);
    if (local_a08._M_string_length == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_720,"Cannot find MakeCommand key in the DartConfiguration.tcl",
                 0x38);
      std::ios::widen((char)(ostream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18));
      std::ostream::put((char)local_720);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x14b,(char *)local_298._0_8_,false);
      if ((_func_int **)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
      std::ios_base::~ios_base(local_6b0);
      iVar14 = -1;
    }
    else {
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      local_720._0_8_ = &local_710;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"BuildDirectory","");
      cmCTest::GetCTestConfiguration(&local_740,pcVar2,(string *)local_720);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_720._0_8_ != &local_710) {
        operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
      }
      if (local_740._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_720,
                   "Cannot find BuildDirectory  key in the DartConfiguration.tcl",0x3c);
        std::ios::widen((char)(ostream *)local_720 + (char)*(undefined8 *)(local_720._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_720);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x154,(char *)local_298._0_8_,false);
        if ((_func_int **)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        iVar14 = -1;
      }
      else {
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        local_720._0_8_ = &local_710;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_720,"UseLaunchers","");
        cmCTest::GetCTestConfiguration(&local_760,pcVar2,(string *)local_720);
        pcVar18 = extraout_RDX;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
          pcVar18 = extraout_RDX_00;
        }
        value._M_str = pcVar18;
        value._M_len = (size_t)local_760._M_dataplus._M_p;
        bVar7 = cmValue::IsOn((cmValue *)local_760._M_string_length,value);
        this->UseCTestLaunch = bVar7;
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        pvVar9 = (vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
                  *)std::chrono::_V2::steady_clock::now();
        bVar7 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)local_298);
        if (!bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_720,"Cannot create build log file",0x1c);
          std::ios::widen((char)(ostream *)local_720 +
                          (char)*(undefined8 *)(local_720._0_8_ + -0x18));
          std::ostream::put((char)local_720);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x161,(char *)local_9e8._0_8_,false);
          if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
            operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
          std::ios_base::~ios_base(local_6b0);
        }
        if (cmCTestErrorMatches[0] != (char *)0x0) {
          ppcVar19 = cmCTestErrorMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorMatches,ppcVar19);
            ppcVar1 = ppcVar19 + 1;
            ppcVar19 = ppcVar19 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestErrorExceptions[0] != (char *)0x0) {
          ppcVar19 = cmCTestErrorExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomErrorExceptions,ppcVar19);
            ppcVar1 = ppcVar19 + 1;
            ppcVar19 = ppcVar19 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningMatches[0] != (char *)0x0) {
          ppcVar19 = cmCTestWarningMatches;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningMatches,ppcVar19);
            ppcVar1 = ppcVar19 + 1;
            ppcVar19 = ppcVar19 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        if (cmCTestWarningExceptions[0] != (char *)0x0) {
          ppcVar19 = cmCTestWarningExceptions;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &this->CustomWarningExceptions,ppcVar19);
            ppcVar1 = ppcVar19 + 1;
            ppcVar19 = ppcVar19 + 1;
          } while (*ppcVar1 != (char *)0x0);
        }
        local_a18 = pvVar9;
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        poVar10 = std::ostream::_M_insert<void_const*>(local_720);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Add this->ErrorMatchRegex",0x19)
        ;
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x185,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        pbVar15 = (this->CustomErrorMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->CustomErrorMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar15 != pbVar3) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_720,"Add this->CustomErrorMatches: ",0x1e);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_720,(pbVar15->_M_dataplus)._M_p,
                                 pbVar15->_M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x185,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
              operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
            std::ios_base::~ios_base(local_6b0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorMatchRegex,pbVar15);
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar3);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        poVar10 = std::ostream::_M_insert<void_const*>(local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Add this->ErrorExceptionRegex",0x1d);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x187,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        pbVar15 = (this->CustomErrorExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->CustomErrorExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar15 != pbVar3) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_720,"Add this->CustomErrorExceptions: ",0x21);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_720,(pbVar15->_M_dataplus)._M_p,
                                 pbVar15->_M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x187,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
              operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
            std::ios_base::~ios_base(local_6b0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->ErrorExceptionRegex,pbVar15);
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar3);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        poVar10 = std::ostream::_M_insert<void_const*>(local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Add this->WarningMatchRegex",0x1b);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x189,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        pbVar15 = (this->CustomWarningMatches).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->CustomWarningMatches).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar15 != pbVar3) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_720,"Add this->CustomWarningMatches: ",0x20);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_720,(pbVar15->_M_dataplus)._M_p,
                                 pbVar15->_M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x189,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
              operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
            std::ios_base::~ios_base(local_6b0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningMatchRegex,pbVar15);
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar3);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
        poVar10 = std::ostream::_M_insert<void_const*>(local_720);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"Add this->WarningExceptionRegex",0x1f);
        std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
        std::ostream::put((char)poVar10);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x18b,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
        std::ios_base::~ios_base(local_6b0);
        pbVar15 = (this->CustomWarningExceptions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (this->CustomWarningExceptions).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar15 != pbVar3) {
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_720,"Add this->CustomWarningExceptions: ",0x23);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_720,(pbVar15->_M_dataplus)._M_p,
                                 pbVar15->_M_string_length);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x18b,(char *)local_9e8._0_8_,(this->super_cmCTestGenericHandler).Quiet);
            if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
              operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
            std::ios_base::~ios_base(local_6b0);
            std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                       &this->WarningExceptionRegex,pbVar15);
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar3);
        }
        (this->SimplifySourceDir)._M_string_length = 0;
        *(this->SimplifySourceDir)._M_dataplus._M_p = '\0';
        (this->SimplifyBuildDir)._M_string_length = 0;
        *(this->SimplifyBuildDir)._M_dataplus._M_p = '\0';
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        local_9e8._0_8_ = local_9e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"SourceDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_720,pcVar2,(string *)local_9e8);
        uVar6 = local_720._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        this_00 = &this->SimplifySourceDir;
        if ((char *)0x14 < (ulong)uVar6) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_410._0_8_ = local_410 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"SourceDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_9e8,pcVar2,(string *)local_410);
          plVar11 = (long *)std::__cxx11::string::append(local_9e8);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar13) {
            local_710._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_710._8_8_ = plVar11[3];
            local_720._0_8_ = &local_710;
          }
          else {
            local_710._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_720._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_720._8_8_ = plVar11[1];
          *plVar11 = (long)paVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
            operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
          }
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
          lVar16 = std::__cxx11::string::rfind((char)local_720,0x2f);
          if (lVar16 != -1) {
            std::__cxx11::string::resize((ulong)local_720,(char)lVar16 + '\x01');
            std::__cxx11::string::operator=((string *)this_00,(string *)local_720);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_720._0_8_ != &local_710) {
            operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
          }
        }
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        local_9e8._0_8_ = local_9e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"BuildDirectory","");
        cmCTest::GetCTestConfiguration((string *)local_720,pcVar2,(string *)local_9e8);
        uVar6 = local_720._8_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
        }
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        this_01 = &this->SimplifyBuildDir;
        if ((char *)0x14 < (ulong)uVar6) {
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          local_410._0_8_ = local_410 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"BuildDirectory","");
          cmCTest::GetCTestConfiguration((string *)local_9e8,pcVar2,(string *)local_410);
          plVar11 = (long *)std::__cxx11::string::append(local_9e8);
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 == paVar13) {
            local_710._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_710._8_8_ = plVar11[3];
            local_720._0_8_ = &local_710;
          }
          else {
            local_710._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_720._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar11;
          }
          local_720._8_8_ = plVar11[1];
          *plVar11 = (long)paVar13;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
            operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
          }
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
          lVar16 = std::__cxx11::string::rfind((char)local_720,0x2f);
          if (lVar16 != -1) {
            std::__cxx11::string::resize((ulong)local_720,(char)lVar16 + '\x01');
            std::__cxx11::string::operator=((string *)this_01,(string *)local_720);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_720._0_8_ != &local_710) {
            operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
          }
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_720,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)local_720);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
        }
        rVar12 = std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = rVar12;
        local_9e8._0_8_ = local_9e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_9e8,"\x1b\\[[0-9;]*m","");
        local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"");
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)local_720,(string *)local_9e8,&local_780,
                   (cmMakefile *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_780._M_dataplus._M_p != &local_780.field_2) {
          operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        this->ColorRemover = (cmStringReplaceHelper *)local_720;
        local_a3c = 0;
        bVar7 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar7) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_9e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_9e8,"Build with command: ",0x14);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_9e8,local_a08._M_dataplus._M_p,
                               local_a08._M_string_length);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1b3,(char *)local_410._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
            operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_9e8);
          std::ios_base::~ios_base(local_978);
          local_a0c = 0;
        }
        else {
          bVar7 = RunMakeCommand(this,&local_a08,&local_a3c,local_740._M_dataplus._M_p,0,
                                 (ostream *)local_298,Auto);
          local_a0c = (uint)CONCAT71(extraout_var,bVar7) ^ 1;
        }
        cmCTest::CurrentTime_abi_cxx11_
                  ((string *)local_9e8,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)local_9e8);
        if ((undefined1 *)local_9e8._0_8_ != local_9e8 + 0x10) {
          operator_delete((void *)local_9e8._0_8_,local_9e8._16_8_ + 1);
        }
        rVar12 = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = rVar12;
        lVar16 = std::chrono::_V2::steady_clock::now();
        if ((this->SimplifySourceDir)._M_string_length != 0) {
          pcVar4 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar20 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar20 != pcVar4;
              pcVar20 = pcVar20 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar20->Text,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar20->PreContext,(this_00->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar20->PostContext,(this_00->_M_dataplus)._M_p,"/.../");
          }
        }
        if ((this->SimplifyBuildDir)._M_string_length != 0) {
          pcVar4 = (this->ErrorsAndWarnings).
                   super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pcVar20 = (this->ErrorsAndWarnings).
                         super__Vector_base<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                         ._M_impl.super__Vector_impl_data._M_start; pcVar20 != pcVar4;
              pcVar20 = pcVar20 + 1) {
            cmsys::SystemTools::ReplaceString(&pcVar20->Text,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar20->PreContext,(this_01->_M_dataplus)._M_p,"/.../");
            cmsys::SystemTools::ReplaceString
                      (&pcVar20->PostContext,(this_01->_M_dataplus)._M_p,"/.../");
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_9e8,None);
        bVar7 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_9e8);
        if (bVar7) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_468,(ostream *)local_9e8,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_468);
          if (this->UseCTestLaunch == true) {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_468);
          }
          else {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_468);
          }
          GenerateXMLFooter(this,(cmXMLWriter *)local_468,
                            (cmDuration)((double)(lVar16 - (long)local_a18) / 1000000000.0));
          if (((char)local_a0c != '\0' || local_a3c != 0) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_410,"Error(s) when building project",0x1e);
            std::ios::widen((char)(ostream *)local_410 +
                            (char)*(undefined8 *)(local_410._0_8_ + -0x18));
            std::ostream::put((char)local_410);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1e5,(char *)local_a38,false);
            if (local_a38 != local_a28) {
              operator_delete(local_a38,local_a28[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
            std::ios_base::~ios_base(local_3a0);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,"   ",3);
          poVar10 = (ostream *)std::ostream::operator<<(local_410,this->TotalErrors);
          pcVar18 = " or more";
          pcVar17 = " or more";
          if (this->TotalErrors < this->MaxErrors) {
            pcVar17 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,pcVar17,(ulong)(this->MaxErrors <= this->TotalErrors) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," Compiler errors",0x10);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ec,(char *)local_a38,false);
          if (local_a38 != local_a28) {
            operator_delete(local_a38,local_a28[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          std::ios_base::~ios_base(local_3a0);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_410,"   ",3);
          poVar10 = (ostream *)std::ostream::operator<<(local_410,this->TotalWarnings);
          if (this->TotalWarnings < this->MaxWarnings) {
            pcVar18 = "";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,pcVar18,(ulong)(this->MaxWarnings <= this->TotalWarnings) << 3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," Compiler warnings",0x12);
          std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1f1,(char *)local_a38,false);
          if (local_a38 != local_a28) {
            operator_delete(local_a38,local_a28[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          std::ios_base::~ios_base(local_3a0);
          iVar14 = local_a3c;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_468);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_410,"Cannot create build XML file",0x1c);
          std::ios::widen((char)(ostream *)local_410 +
                          (char)*(undefined8 *)(local_410._0_8_ + -0x18));
          std::ostream::put((char)local_410);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d7,(char *)local_468._0_8_,false);
          if ((ostream *)local_468._0_8_ != (ostream *)(local_468 + 0x10)) {
            operator_delete((void *)local_468._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_468._16_8_)->_M_p + 1));
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
          std::ios_base::~ios_base(local_3a0);
          iVar14 = -1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_9e8);
        std::
        vector<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
        ::~vector(&local_488);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a8._M_p != &local_498) {
          operator_delete(local_4a8._M_p,local_498._M_allocated_capacity + 1);
        }
        if (local_4c0 != (char *)0x0) {
          operator_delete__(local_4c0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_p != local_6f0) {
          operator_delete(local_700._M_p,(ulong)(local_6f0[0]._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_720._0_8_ != &local_710) {
          operator_delete((void *)local_720._0_8_,(ulong)(local_710._M_allocated_capacity + 1));
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._M_dataplus._M_p != &local_760.field_2) {
          operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_740._M_dataplus._M_p != &local_740.field_2) {
        operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a08._M_dataplus._M_p != &local_a08.field_2) {
      operator_delete(local_a08._M_dataplus._M_p,local_a08.field_2._M_allocated_capacity + 1);
    }
  }
  return iVar14;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  bool res = true;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (!res || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}